

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::WriteAliasedRaw
          (CopyingOutputStreamAdaptor *this,void *data,int size)

{
  bool bVar1;
  int iVar2;
  LogMessage *other;
  int out_size;
  void *out;
  int local_64;
  LogMessage local_60;
  
  if (size < this->buffer_size_) {
    iVar2 = (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[2])
                      (this,&local_60,&local_64);
    if ((char)iVar2 != '\0') {
      do {
        if (size <= local_64) {
          memcpy((void *)local_60._0_8_,data,(long)size);
          (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[3])
                    (this,(ulong)(uint)(local_64 - size));
          return true;
        }
        memcpy((void *)local_60._0_8_,data,(long)local_64);
        data = (void *)((long)data + (long)local_64);
        size = size - local_64;
        iVar2 = (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[2])
                          (this,&local_60,&local_64);
      } while ((char)iVar2 != '\0');
    }
  }
  else {
    bVar1 = WriteBuffer(this);
    if ((bVar1) &&
       (iVar2 = (*this->copying_stream_->_vptr_CopyingOutputStream[2])
                          (this->copying_stream_,data,(ulong)(uint)size), (char)iVar2 != '\0')) {
      if (this->buffer_used_ != 0) {
        internal::LogMessage::LogMessage
                  (&local_60,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                   ,0x15e);
        other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (buffer_used_) == (0): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_64,other);
        internal::LogMessage::~LogMessage(&local_60);
      }
      this->position_ = this->position_ + (long)size;
      return true;
    }
  }
  return false;
}

Assistant:

bool CopyingOutputStreamAdaptor::WriteAliasedRaw(const void* data, int size) {
  if (size >= buffer_size_) {
    if (!Flush() || !copying_stream_->Write(data, size)) {
      return false;
    }
    GOOGLE_DCHECK_EQ(buffer_used_, 0);
    position_ += size;
    return true;
  }

  void* out;
  int out_size;
  while (true) {
    if (!Next(&out, &out_size)) {
      return false;
    }

    if (size <= out_size) {
      std::memcpy(out, data, size);
      BackUp(out_size - size);
      return true;
    }

    std::memcpy(out, data, out_size);
    data = static_cast<const char*>(data) + out_size;
    size -= out_size;
  }
  return true;
}